

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O1

DdNode * Cudd_addHamming(DdManager *dd,DdNode **xVars,DdNode **yVars,int nVars)

{
  int *piVar1;
  DdNode *B;
  DdNode *f;
  DdNode *pDVar2;
  DdNode *g;
  ulong uVar3;
  
  pDVar2 = dd->zero;
  piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  if (0 < nVars) {
    uVar3 = 0;
    g = pDVar2;
    do {
      B = Cudd_bddIte(dd,xVars[uVar3],(DdNode *)((ulong)yVars[uVar3] ^ 1),yVars[uVar3]);
      if (B == (DdNode *)0x0) goto LAB_0078a0ce;
      piVar1 = (int *)(((ulong)B & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      f = Cudd_BddToAdd(dd,B);
      if (f == (DdNode *)0x0) {
LAB_0078a0c9:
        Cudd_RecursiveDeref(dd,B);
LAB_0078a0ce:
        Cudd_RecursiveDeref(dd,g);
        return (DdNode *)0x0;
      }
      piVar1 = (int *)(((ulong)f & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(dd,B);
      pDVar2 = Cudd_addApply(dd,Cudd_addPlus,f,g);
      B = f;
      if (pDVar2 == (DdNode *)0x0) goto LAB_0078a0c9;
      piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(dd,f);
      Cudd_RecursiveDeref(dd,g);
      uVar3 = uVar3 + 1;
      g = pDVar2;
    } while ((uint)nVars != uVar3);
  }
  piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + -1;
  return pDVar2;
}

Assistant:

DdNode *
Cudd_addHamming(
  DdManager * dd,
  DdNode ** xVars,
  DdNode ** yVars,
  int  nVars)
{
    DdNode  *result,*tempBdd;
    DdNode  *tempAdd,*temp;
    int     i;

    result = DD_ZERO(dd);
    cuddRef(result);

    for (i = 0; i < nVars; i++) {
        tempBdd = Cudd_bddIte(dd,xVars[i],Cudd_Not(yVars[i]),yVars[i]);
        if (tempBdd == NULL) {
            Cudd_RecursiveDeref(dd,result);
            return(NULL);
        }
        cuddRef(tempBdd);
        tempAdd = Cudd_BddToAdd(dd,tempBdd);
        if (tempAdd == NULL) {
            Cudd_RecursiveDeref(dd,tempBdd);
            Cudd_RecursiveDeref(dd,result);
            return(NULL);
        }
        cuddRef(tempAdd);
        Cudd_RecursiveDeref(dd,tempBdd);
        temp = Cudd_addApply(dd,Cudd_addPlus,tempAdd,result);
        if (temp == NULL) {
            Cudd_RecursiveDeref(dd,tempAdd);
            Cudd_RecursiveDeref(dd,result);
            return(NULL);
        }
        cuddRef(temp);
        Cudd_RecursiveDeref(dd,tempAdd);
        Cudd_RecursiveDeref(dd,result);
        result = temp;
    }

    cuddDeref(result);
    return(result);

}